

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throttle.cpp
# Opt level: O3

void throttle_copy(Metric *src,Metric *dst,Duration cooldown_period,Duration chunk_interval)

{
  pointer pTVar1;
  size_t sVar3;
  ostream *poVar4;
  TimePoint begin;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> tVar6;
  pointer pTVar7;
  ulong uVar8;
  pair<hta::Clock::time_point,_hta::Clock::time_point> pVar9;
  TimeValue tv;
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> data;
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> local_90;
  long local_78;
  double local_70;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_68;
  Metric *local_60;
  rep local_58;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_50;
  Metric *local_48;
  rep local_40;
  Value local_38;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> tVar2;
  duration dVar5;
  
  local_58 = chunk_interval.__r;
  local_48 = dst;
  local_40 = cooldown_period.__r;
  pVar9 = hta::Metric::range(src);
  dVar5.__r = (rep)pVar9.second.
                   super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   .__d.__r;
  tVar2.__d.__r =
       (duration)
       pVar9.first.
       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
       __r;
  local_60 = src;
  sVar3 = hta::Metric::count(src);
  local_68.__d.__r = (duration)(duration)dVar5.__r;
  if ((long)tVar2.__d.__r <= dVar5.__r) {
    local_70 = (double)(dVar5.__r - (long)tVar2.__d.__r);
    uVar8 = 0;
    tVar6.__d.__r = (duration)0;
    local_78 = (long)tVar2.__d.__r;
    do {
      local_68.__d.__r =
           (duration)
           pVar9.second.
           super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
           __d.__r;
      begin.super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      .__d.__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                 )pVar9.first.
                  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  .__d.__r;
      print_progress((double)((long)begin.
                                    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    .__d.__r - (long)tVar2.__d.__r) / local_70);
      local_50.__d.__r =
           (duration)
           ((long)begin.
                  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  .__d.__r + local_58);
      hta::Metric::retrieve(&local_90,local_60,begin,(TimePoint)local_50.__d.__r,(IntervalScope)0x1)
      ;
      pTVar1 = local_90.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
               super__Vector_impl_data._M_finish;
      tVar2.__d.__r = (duration)(duration)local_78;
      for (pTVar7 = local_90.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>.
                    _M_impl.super__Vector_impl_data._M_start; local_78 = (long)tVar2.__d.__r,
          pTVar7 != pTVar1; pTVar7 = pTVar7 + 1) {
        uVar8 = uVar8 + 1;
        dVar5.__r = (pTVar7->time).
                    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    .__d.__r;
        local_38 = pTVar7->value;
        if ((sVar3 == uVar8) || ((uVar8 / 100000000) * 100000000 - uVar8 == 0)) {
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
        }
        if ((long)tVar6.__d.__r < dVar5.__r) {
          if (local_40 + (long)tVar6.__d.__r < dVar5.__r) {
            tv.value = local_38;
            tv.time.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        )(time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          )dVar5.__r;
            hta::Metric::insert(local_48,tv);
            tVar6.__d.__r = (duration)(duration)dVar5.__r;
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Non-Monotonic time ",0x13);
          std::ostream::_M_insert<long>((long)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at index ",10);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
        }
        tVar2.__d.__r = (duration)(duration)local_78;
      }
      if (local_90.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_90.
                              super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.
                              super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pVar9.second.
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            local_68.__d.__r;
      pVar9.first.
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            local_50.__d.__r;
    } while ((long)local_50.__d.__r <= (long)local_68.__d.__r);
  }
  printf("\r%3d%% [%.*s%*s]",100,0x3c,"||||||||||||||||||||||||||||||||||||||||||||||||||||||||||||"
         ,0,"");
  fflush(_stdout);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"completed, read: ",0x11)
  ;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", written: ",0xb);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void throttle_copy(hta::Metric& src, hta::Metric& dst, hta::Duration cooldown_period,
                   hta::Duration chunk_interval = hta::duration_cast(std::chrono::hours(30 * 24)))
{
    auto total_range = src.range();
    size_t read = 0, written = 0;
    auto count = src.count();
    hta::TimePoint previous_time;
    for (auto t0 = total_range.first; t0 <= total_range.second; t0 += chunk_interval)
    {
        print_progress(static_cast<double>((t0 - total_range.first).count()) /
                       (total_range.second - total_range.first).count());
        auto data = src.retrieve(t0, t0 + chunk_interval, { hta::Scope::closed, hta::Scope::open });
        for (auto tv : data)
        {
            read++;
            if (read % 100000000 == 0 || read == count)
            {
                std::cout << read << " / " << count << std::endl;
            }
            if (tv.time <= previous_time)
            {
                std::cerr << "Non-Monotonic time " << tv.time << " at index " << (read - 1)
                          << std::endl;
                continue;
            }
            if (previous_time + cooldown_period < tv.time)
            {
                previous_time = tv.time;
                dst.insert(tv);
                written++;
            }
        }
    }
    print_progress(1);
    std::cout << "completed, read: " << read << ", written: " << written << std::endl;
}